

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O2

void print_level(v_array<v_array<unsigned_int>_> level)

{
  ostream *poVar1;
  long *plVar2;
  size_t i;
  ulong uVar3;
  size_t t;
  long lVar4;
  long in_stack_00000008;
  long in_stack_00000010;
  
  for (lVar4 = 0; lVar4 != in_stack_00000010 - in_stack_00000008 >> 5; lVar4 = lVar4 + 1) {
    plVar2 = (long *)(lVar4 * 0x20 + in_stack_00000008);
    for (uVar3 = 0; uVar3 < (ulong)(plVar2[1] - *plVar2 >> 2); uVar3 = uVar3 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout," ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    }
    std::operator<<((ostream *)&std::cout," | ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void print_level(v_array<v_array<uint32_t>> level)
{
  for (size_t t = 0; t < level.size(); t++)
  {
    for (size_t i = 0; i < level[t].size(); i++) cout << " " << level[t][i];
    cout << " | ";
  }
  cout << endl;
}